

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O3

void Blowfish_encipher(blf_ctx *c,uint32_t *xl,uint32_t *xr)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar7 = c->P[0] ^ *xl;
  uVar6 = c->P[1] ^ *xr ^
          (*(int *)((long)c->S[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) + c->S[0][uVar7 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar7 >> 6 & 0x3fc))) + c->S[3][uVar7 & 0xff];
  uVar7 = (*(int *)((long)c->S[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) + c->S[0][uVar6 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar6 >> 6 & 0x3fc))) + c->S[3][uVar6 & 0xff] ^ c->P[2]
          ^ uVar7;
  uVar6 = (*(int *)((long)c->S[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) + c->S[0][uVar7 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar7 >> 6 & 0x3fc))) + c->S[3][uVar7 & 0xff] ^ c->P[3]
          ^ uVar6;
  uVar7 = (*(int *)((long)c->S[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) + c->S[0][uVar6 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar6 >> 6 & 0x3fc))) + c->S[3][uVar6 & 0xff] ^ c->P[4]
          ^ uVar7;
  uVar6 = (*(int *)((long)c->S[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) + c->S[0][uVar7 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar7 >> 6 & 0x3fc))) + c->S[3][uVar7 & 0xff] ^ c->P[5]
          ^ uVar6;
  uVar7 = (*(int *)((long)c->S[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) + c->S[0][uVar6 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar6 >> 6 & 0x3fc))) + c->S[3][uVar6 & 0xff] ^ c->P[6]
          ^ uVar7;
  uVar6 = (*(int *)((long)c->S[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) + c->S[0][uVar7 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar7 >> 6 & 0x3fc))) + c->S[3][uVar7 & 0xff] ^ c->P[7]
          ^ uVar6;
  uVar7 = (*(int *)((long)c->S[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) + c->S[0][uVar6 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar6 >> 6 & 0x3fc))) + c->S[3][uVar6 & 0xff] ^ c->P[8]
          ^ uVar7;
  uVar6 = (*(int *)((long)c->S[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) + c->S[0][uVar7 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar7 >> 6 & 0x3fc))) + c->S[3][uVar7 & 0xff] ^ c->P[9]
          ^ uVar6;
  uVar7 = (*(int *)((long)c->S[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) + c->S[0][uVar6 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar6 >> 6 & 0x3fc))) + c->S[3][uVar6 & 0xff] ^ c->P[10]
          ^ uVar7;
  uVar6 = (*(int *)((long)c->S[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) + c->S[0][uVar7 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar7 >> 6 & 0x3fc))) + c->S[3][uVar7 & 0xff] ^
          c->P[0xb] ^ uVar6;
  uVar7 = (*(int *)((long)c->S[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) + c->S[0][uVar6 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar6 >> 6 & 0x3fc))) + c->S[3][uVar6 & 0xff] ^
          c->P[0xc] ^ uVar7;
  uVar6 = (*(int *)((long)c->S[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) + c->S[0][uVar7 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar7 >> 6 & 0x3fc))) + c->S[3][uVar7 & 0xff] ^
          c->P[0xd] ^ uVar6;
  uVar7 = (*(int *)((long)c->S[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) + c->S[0][uVar6 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar6 >> 6 & 0x3fc))) + c->S[3][uVar6 & 0xff] ^
          c->P[0xe] ^ uVar7;
  uVar6 = (*(int *)((long)c->S[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) + c->S[0][uVar7 >> 0x18] ^
          *(uint *)((long)c->S[2] + (ulong)(uVar7 >> 6 & 0x3fc))) + c->S[3][uVar7 & 0xff] ^
          c->P[0xf] ^ uVar6;
  iVar1 = *(int *)((long)c->S[1] + (ulong)(uVar6 >> 0xe & 0x3fc));
  uVar2 = c->S[0][uVar6 >> 0x18];
  uVar3 = *(uint *)((long)c->S[2] + (ulong)(uVar6 >> 6 & 0x3fc));
  uVar4 = c->S[3][uVar6 & 0xff];
  uVar5 = c->P[0x10];
  *xl = uVar6 ^ c->P[0x11];
  *xr = (iVar1 + uVar2 ^ uVar3) + uVar4 ^ uVar5 ^ uVar7;
  return;
}

Assistant:

static void
Blowfish_encipher(blf_ctx *c, uint32_t *xl, uint32_t *xr)
{
    uint32_t Xl;
    uint32_t Xr;
    uint32_t *s = c->S[0];
    uint32_t *p = c->P;

    Xl = *xl;
    Xr = *xr;

    Xl ^= p[0];
    BLFRND(s, p, Xr, Xl, 1); BLFRND(s, p, Xl, Xr, 2);
    BLFRND(s, p, Xr, Xl, 3); BLFRND(s, p, Xl, Xr, 4);
    BLFRND(s, p, Xr, Xl, 5); BLFRND(s, p, Xl, Xr, 6);
    BLFRND(s, p, Xr, Xl, 7); BLFRND(s, p, Xl, Xr, 8);
    BLFRND(s, p, Xr, Xl, 9); BLFRND(s, p, Xl, Xr, 10);
    BLFRND(s, p, Xr, Xl, 11); BLFRND(s, p, Xl, Xr, 12);
    BLFRND(s, p, Xr, Xl, 13); BLFRND(s, p, Xl, Xr, 14);
    BLFRND(s, p, Xr, Xl, 15); BLFRND(s, p, Xl, Xr, 16);

    *xl = Xr ^ p[17];
    *xr = Xl;
}